

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O3

bool __thiscall
semver::detail::range_comparator<int,_int,_int>::contains
          (range_comparator<int,_int,_int> *this,version<int,_int,_int> *other)

{
  int iVar1;
  bool bVar2;
  prerelease_comparator local_5;
  prerelease_comparator local_4;
  prerelease_comparator local_3;
  prerelease_comparator local_2;
  prerelease_comparator local_1;
  
  switch(this->op) {
  case less:
    iVar1 = other->major_ - (this->v).major_;
    if (((iVar1 == 0) && (iVar1 = other->minor_ - (this->v).minor_, iVar1 == 0)) &&
       (iVar1 = other->patch_ - (this->v).patch_, iVar1 == 0)) {
      iVar1 = prerelease_comparator::compare<int,int,int>(&local_5,other,&this->v);
    }
    bVar2 = SUB41((uint)iVar1 >> 0x1f,0);
    break;
  case less_or_equal:
    iVar1 = other->major_ - (this->v).major_;
    if (((iVar1 == 0) && (iVar1 = other->minor_ - (this->v).minor_, iVar1 == 0)) &&
       (iVar1 = other->patch_ - (this->v).patch_, iVar1 == 0)) {
      iVar1 = prerelease_comparator::compare<int,int,int>(&local_4,other,&this->v);
    }
    bVar2 = iVar1 < 1;
    break;
  case greater:
    iVar1 = other->major_ - (this->v).major_;
    if (((iVar1 == 0) && (iVar1 = other->minor_ - (this->v).minor_, iVar1 == 0)) &&
       (iVar1 = other->patch_ - (this->v).patch_, iVar1 == 0)) {
      iVar1 = prerelease_comparator::compare<int,int,int>(&local_3,other,&this->v);
    }
    bVar2 = 0 < iVar1;
    break;
  case greater_or_equal:
    iVar1 = other->major_ - (this->v).major_;
    if (((iVar1 == 0) && (iVar1 = other->minor_ - (this->v).minor_, iVar1 == 0)) &&
       (iVar1 = other->patch_ - (this->v).patch_, iVar1 == 0)) {
      iVar1 = prerelease_comparator::compare<int,int,int>(&local_2,other,&this->v);
    }
    bVar2 = -1 < iVar1;
    break;
  case equal:
    if (((other->major_ == (this->v).major_) && (other->minor_ == (this->v).minor_)) &&
       (other->patch_ == (this->v).patch_)) {
      iVar1 = prerelease_comparator::compare<int,int,int>(&local_1,other,&this->v);
      return iVar1 == 0;
    }
  default:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

SEMVER_CONSTEXPR bool contains(const version<I1, I2, I3>& other) const noexcept {
      switch (op) {
      case range_operator::less:
        return detail::compare_parsed(other, v, version_compare_option::include_prerelease) < 0;
      case range_operator::less_or_equal:
        return detail::compare_parsed(other, v, version_compare_option::include_prerelease) <= 0;
      case range_operator::greater:
        return detail::compare_parsed(other, v, version_compare_option::include_prerelease) > 0;
      case range_operator::greater_or_equal:
        return detail::compare_parsed(other, v, version_compare_option::include_prerelease) >= 0;
      case range_operator::equal:
        return detail::compare_parsed(other, v, version_compare_option::include_prerelease) == 0;
      }
      return false;
    }